

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O2

void picosha2::detail::hash256_block<unsigned_long*,unsigned_char*>
               (unsigned_long *message_digest,uchar *first,uchar *last)

{
  uint uVar1;
  size_t i;
  long lVar2;
  word_t wVar3;
  word_t wVar4;
  word_t wVar5;
  word_t x;
  size_t i_1;
  unsigned_long uVar6;
  int iVar7;
  unsigned_long uVar8;
  int aiStack_2b8 [2];
  word_t awStack_2b0 [8];
  int aiStack_270 [2];
  word_t local_268;
  unsigned_long *local_260;
  unsigned_long local_258;
  word_t local_250;
  word_t local_248;
  unsigned_long local_240;
  word_t w [64];
  
  if (first + 0x40 == last) {
    for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 8) {
      *(undefined8 *)((long)w + lVar2) = 0;
    }
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      uVar1 = *(uint *)(first + lVar2 * 4);
      w[lVar2] = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18);
    }
    for (lVar2 = 0x10; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      aiStack_270[0] = 0x103913;
      aiStack_270[1] = 0;
      wVar3 = ssig1((&local_248)[lVar2]);
      iVar7 = aiStack_270[lVar2 * 2];
      aiStack_270[0] = 0x103925;
      aiStack_270[1] = 0;
      wVar4 = ssig0(awStack_2b0[lVar2]);
      w[lVar2] = (ulong)(uint)((int)wVar4 + (int)wVar3 + iVar7 + aiStack_2b8[lVar2 * 2]);
    }
    local_248 = *message_digest;
    uVar8 = message_digest[1];
    local_268 = message_digest[6];
    lVar2 = 0;
    wVar3 = message_digest[4];
    wVar4 = message_digest[7];
    local_240 = message_digest[2];
    local_258 = message_digest[3];
    wVar5 = message_digest[5];
    local_260 = message_digest;
    while( true ) {
      uVar6 = local_240;
      x = wVar3;
      wVar3 = local_268;
      if (lVar2 == 0x200) break;
      local_250 = local_268;
      aiStack_270[0] = 0x1039a2;
      aiStack_270[1] = 0;
      local_268 = wVar5;
      local_240 = uVar8;
      wVar5 = bsig1(x);
      uVar8 = local_248;
      iVar7 = (int)wVar5 + (int)wVar4 + ((uint)local_268 & (uint)x) + (~(uint)x & (uint)wVar3) +
              *(int *)((long)&add_constant + lVar2) + *(int *)((long)w + lVar2);
      aiStack_270[0] = 0x1039d8;
      aiStack_270[1] = 0;
      wVar3 = bsig0(local_248);
      local_248 = (word_t)((int)wVar3 +
                           ((uint)uVar6 & (uint)local_240 ^
                           (uint)uVar8 & ((uint)uVar6 ^ (uint)local_240)) + iVar7);
      lVar2 = lVar2 + 8;
      wVar3 = (ulong)(uint)((int)local_258 + iVar7);
      wVar4 = local_250;
      local_258 = uVar6;
      wVar5 = x;
    }
    *local_260 = *local_260 + local_248;
    local_260[1] = local_260[1] + uVar8;
    local_260[2] = local_260[2] + uVar6;
    local_260[3] = local_260[3] + local_258;
    local_260[4] = local_260[4] + x;
    local_260[5] = local_260[5] + wVar5;
    local_260[6] = local_260[6] + local_268;
    local_260[7] = local_260[7] + wVar4;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      *(undefined4 *)((long)local_260 + lVar2 * 8 + 4) = 0;
    }
    return;
  }
  aiStack_270[0] = 0x103a75;
  aiStack_270[1] = 0;
  __assert_fail("first + 64 == last",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/simontime[P]devicecert-validator/picosha2.h"
                ,0x5d,
                "void picosha2::detail::hash256_block(RaIter1, RaIter2, RaIter2) [RaIter1 = unsigned long *, RaIter2 = unsigned char *]"
               );
}

Assistant:

void hash256_block(RaIter1 message_digest, RaIter2 first, RaIter2 last) {
    assert(first + 64 == last);
    static_cast<void>(last);  // for avoiding unused-variable warning
    word_t w[64];
    std::fill(w, w + 64, 0);
    for (std::size_t i = 0; i < 16; ++i) {
        w[i] = (static_cast<word_t>(mask_8bit(*(first + i * 4))) << 24) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 1))) << 16) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 2))) << 8) |
               (static_cast<word_t>(mask_8bit(*(first + i * 4 + 3))));
    }
    for (std::size_t i = 16; i < 64; ++i) {
        w[i] = mask_32bit(ssig1(w[i - 2]) + w[i - 7] + ssig0(w[i - 15]) +
                          w[i - 16]);
    }

    word_t a = *message_digest;
    word_t b = *(message_digest + 1);
    word_t c = *(message_digest + 2);
    word_t d = *(message_digest + 3);
    word_t e = *(message_digest + 4);
    word_t f = *(message_digest + 5);
    word_t g = *(message_digest + 6);
    word_t h = *(message_digest + 7);

    for (std::size_t i = 0; i < 64; ++i) {
        word_t temp1 = h + bsig1(e) + ch(e, f, g) + add_constant[i] + w[i];
        word_t temp2 = bsig0(a) + maj(a, b, c);
        h = g;
        g = f;
        f = e;
        e = mask_32bit(d + temp1);
        d = c;
        c = b;
        b = a;
        a = mask_32bit(temp1 + temp2);
    }
    *message_digest += a;
    *(message_digest + 1) += b;
    *(message_digest + 2) += c;
    *(message_digest + 3) += d;
    *(message_digest + 4) += e;
    *(message_digest + 5) += f;
    *(message_digest + 6) += g;
    *(message_digest + 7) += h;
    for (std::size_t i = 0; i < 8; ++i) {
        *(message_digest + i) = mask_32bit(*(message_digest + i));
    }
}